

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadTest::Operation::modifyGLObject
          (Operation *this,SharedPtr<deqp::egl::GLES2ThreadTest::Object> *object)

{
  deInt32 *pdVar1;
  Object *pOVar2;
  SharedPtrStateBase *pSVar3;
  SharedPtr<tcu::ThreadUtil::Event> local_30;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_20;
  
  pOVar2 = object->m_ptr;
  local_30.m_ptr = (this->super_Operation).m_event.m_ptr;
  local_30.m_state = (this->super_Operation).m_event.m_state;
  if (local_30.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_30.m_state)->strongRefCount = (local_30.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_30.m_state)->weakRefCount = (local_30.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  tcu::ThreadUtil::Object::modify(&pOVar2->super_Object,&local_30,&(this->super_Operation).m_deps);
  if (local_30.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_30.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_30.m_ptr = (Event *)0x0;
      (*(local_30.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_30.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_30.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_30.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_30.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pOVar2 = object->m_ptr;
  local_20.m_ptr = (this->m_sync).m_ptr;
  local_20.m_state = (this->m_sync).m_state;
  if (local_20.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_20.m_state)->strongRefCount = (local_20.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_20.m_state)->weakRefCount = (local_20.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Object::modifyGL(pOVar2,&local_20,&this->m_syncDeps);
  pSVar3 = local_20.m_state;
  if (local_20.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_20.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_20.m_ptr = (FenceSync *)0x0;
      (*(local_20.m_state)->_vptr_SharedPtrStateBase[2])(local_20.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_20.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_20.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

void Operation::modifyGLObject (SharedPtr<Object> object)
{
	object->modify(m_event, m_deps);
	object->modifyGL(m_sync, m_syncDeps);
}